

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

OsStackTraceGetterInterface * __thiscall
testing::internal::UnitTestImpl::os_stack_trace_getter(UnitTestImpl *this)

{
  _func_int **pp_Var1;
  OsStackTraceGetter *in_RDI;
  
  if (in_RDI[0x50].super_OsStackTraceGetterInterface._vptr_OsStackTraceGetterInterface ==
      (_func_int **)0x0) {
    pp_Var1 = (_func_int **)operator_new(8);
    OsStackTraceGetter::OsStackTraceGetter(in_RDI);
    in_RDI[0x50].super_OsStackTraceGetterInterface._vptr_OsStackTraceGetterInterface = pp_Var1;
  }
  return (OsStackTraceGetterInterface *)
         in_RDI[0x50].super_OsStackTraceGetterInterface._vptr_OsStackTraceGetterInterface;
}

Assistant:

OsStackTraceGetterInterface* UnitTestImpl::os_stack_trace_getter() {
  if (os_stack_trace_getter_ == nullptr) {
#ifdef GTEST_OS_STACK_TRACE_GETTER_
    os_stack_trace_getter_ = new GTEST_OS_STACK_TRACE_GETTER_;
#else
    os_stack_trace_getter_ = new OsStackTraceGetter;
#endif  // GTEST_OS_STACK_TRACE_GETTER_
  }

  return os_stack_trace_getter_;
}